

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.h
# Opt level: O3

void AssertNoMatch(CMReturn In)

{
  size_type *psVar1;
  byte bVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  ulong uVar6;
  string result;
  _CM_RETURN_STATUS local_d4;
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  string local_90;
  long *local_70;
  ulong local_68;
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_d4 = NO_MATCH;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"AssertNoMatch","");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_50);
  local_b0 = &local_a0;
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_a0 = *puVar5;
    uStack_98 = (undefined4)plVar3[3];
    uStack_94 = *(undefined4 *)((long)plVar3 + 0x1c);
  }
  else {
    local_a0 = *puVar5;
    local_b0 = (ulong *)*plVar3;
  }
  local_a8 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"NO_MATCH == In.Status","");
  local_d0 = &local_c0;
  local_c8 = 0;
  local_c0 = 0;
  std::__cxx11::string::reserve((ulong)&local_d0);
  if (local_68 != 0) {
    uVar6 = 0;
    do {
      bVar2 = *(byte *)((long)local_70 + uVar6);
      if (bVar2 < 0xd) {
        if ((bVar2 != 9) && (bVar2 != 10)) goto LAB_00107a5d;
LAB_00107a6d:
        std::__cxx11::string::append((char *)&local_d0);
      }
      else {
        if ((bVar2 == 0xd) || (bVar2 == 0x5c)) goto LAB_00107a6d;
LAB_00107a5d:
        std::__cxx11::string::push_back((char)&local_d0);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < local_68);
  }
  uVar6 = 0xf;
  if (local_b0 != &local_a0) {
    uVar6 = local_a0;
  }
  if (uVar6 < (ulong)(local_c8 + local_a8)) {
    uVar6 = 0xf;
    if (local_d0 != &local_c0) {
      uVar6 = CONCAT71(uStack_bf,local_c0);
    }
    if ((ulong)(local_c8 + local_a8) <= uVar6) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_b0);
      goto LAB_00107ae3;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_d0);
LAB_00107ae3:
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  psVar1 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_90.field_2._M_allocated_capacity = *psVar1;
    local_90.field_2._8_8_ = puVar4[3];
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar1;
    local_90._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_90._M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  cute::assert_equal<_CM_RETURN_STATUS,_CM_RETURN_STATUS>
            (&local_d4,(_CM_RETURN_STATUS *)&result.field_2._M_allocated_capacity,&local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/UnitTest.h"
             ,0x21);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void AssertNoMatch(CMReturn In)
{
	ASSERT_EQUAL(NO_MATCH, In.Status);
}